

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O1

void __thiscall
afsm::test::TranFSM_StaticHandledEvents_Test::TestBody(TranFSM_StaticHandledEvents_Test *this)

{
  bool bVar1;
  event_set *peVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  char *in_R9;
  AssertionResult gtest_ar_;
  connection_fsm fsm;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  AssertHelper local_2f0;
  internal local_2e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  string local_2d8;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  local_2b8;
  
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&local_2b8);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::connect>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::connect>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::connect>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 != p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Immediately handled event",0x19);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::connect>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x185,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::terminate>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::terminate>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::terminate>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 != p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Immediately handled event",0x19);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::terminate>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x188,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::complete>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::complete>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::complete>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 != p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Immediately handled event",0x19);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::complete>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x18b,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::conn_error>::id])
  {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::conn_error>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::conn_error>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 != p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Immediately handled event",0x19);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::conn_error>::id )","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x18e,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) <
                &detail::event<afsm::test::events::ready_for_query>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::ready_for_query>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::ready_for_query>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 != p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Immediately handled event",0x19);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id )",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x191,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::begin>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::begin>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4, &detail::event<afsm::test::events::begin>::id < *(undefined1 **)(p_Var4 + 1))
     ) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 != p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Immediately handled event",0x19);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::begin>::id )","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x194,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::commit>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::commit>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4, &detail::event<afsm::test::events::commit>::id < *(undefined1 **)(p_Var4 + 1)
     )) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 == p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Event handled by a nested state",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::commit>::id )","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x199,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) < &detail::event<afsm::test::events::row_event>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::row_event>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::row_event>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 == p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Event handled by a nested state",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::row_event>::id )","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x19c,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  p_Var3 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)
               [*(undefined1 **)(p_Var5 + 1) <
                &detail::event<afsm::test::events::command_complete>::id]) {
    if (*(undefined1 **)(p_Var5 + 1) >= &detail::event<afsm::test::events::command_complete>::id) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
     (p_Var5 = p_Var4,
     &detail::event<afsm::test::events::command_complete>::id < *(undefined1 **)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  local_2e8[0] = (internal)((_Rb_tree_header *)p_Var5 == p_Var3);
  local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_2e8[0]) {
    testing::Message::Message((Message *)&local_2f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2f8.ptr_ + 0x10),"Event handled by a nested state",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2d8,local_2e8,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::command_complete>::id )",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x19f,local_2d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_2f8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2f8.ptr_ + 8))();
      }
      local_2f8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8.
  super_state_machine_base<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  .super_type.
  super_state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  .super_state_base<afsm::test::connection_fsm_def>.super_type.super_connection_fsm_def.
  super_state_machine<connection_fsm_def,_def::tags::common_base<state_name>_>.
  super_state_def<afsm::test::connection_fsm_def,_afsm::def::tags::common_base<afsm::test::state_name>_>
  .super_common_base<afsm::test::state_name>.super_state_name._vptr_state_name =
       (type)&PTR__state_machine_0043eeb8;
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_2b8.deferred_event_ids_._M_t);
  std::__cxx11::
  _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::_M_clear(&local_2b8.deferred_events_.
              super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            );
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::~deque(&local_2b8.queued_events_);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_2b8.deferred_._M_t);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_2b8.handled_._M_t);
  if (local_2b8.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
      super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(TranFSM, StaticHandledEvents)
{
    connection_fsm fsm;

    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::connect>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::terminate>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::complete>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::conn_error>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::begin>::id ))
            << "Immediately handled event";


    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::commit>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::row_event>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::command_complete>::id ))
            << "Event handled by a nested state";
}